

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodePtr xmlXPathNextFollowingSibling(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  xmlNodePtr pxVar2;
  
  if ((((ctxt != (xmlXPathParserContextPtr)0x0) &&
       (pxVar1 = ctxt->context, pxVar1 != (xmlXPathContextPtr)0x0)) &&
      ((pxVar1->node->type | XML_ATTRIBUTE_DECL) != XML_NAMESPACE_DECL)) &&
     (pxVar1->doc != (xmlDocPtr)cur)) {
    pxVar2 = pxVar1->node;
    if (cur != (xmlNodePtr)0x0) {
      pxVar2 = cur;
    }
    return pxVar2->next;
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextFollowingSibling(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
	(ctxt->context->node->type == XML_NAMESPACE_DECL))
	return(NULL);
    if (cur == (xmlNodePtr) ctxt->context->doc)
        return(NULL);
    if (cur == NULL)
        return(ctxt->context->node->next);
    return(cur->next);
}